

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_BOOL FindSlaveGetFixedAddr
                    (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_DWORD dwSlaveInstance,
                    EC_T_DWORD dwVendorId,EC_T_DWORD dwProductCode,EC_T_WORD *pwPhysAddr)

{
  uint uVar1;
  undefined1 local_ac [8];
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  uint uStack_38;
  EC_T_WORD wAutoIncAddress;
  EC_T_DWORD dwSlaveInstanceCnt;
  EC_T_DWORD dwSlaveIdx;
  EC_T_DWORD dwRes;
  EC_T_WORD *pwPhysAddr_local;
  EC_T_DWORD dwProductCode_local;
  EC_T_DWORD dwVendorId_local;
  EC_T_DWORD dwSlaveInstance_local;
  CAtEmLogging *poLog_local;
  EC_T_DWORD dwInstanceID_local;
  
  oBusSlaveInfo.adwReserved[2] = 0;
  uStack_38 = 0;
  do {
    uVar1 = emGetNumConnectedSlaves(dwInstanceID);
    if (uVar1 <= uStack_38) {
      return 0;
    }
    oBusSlaveInfo.adwReserved[1]._2_2_ = -(short)uStack_38;
    uVar1 = emGetBusSlaveInfo(dwInstanceID,0,oBusSlaveInfo.adwReserved[1]._2_2_,local_ac);
    if (uVar1 == 0) {
      if ((oBusSlaveInfo.bDcSupport == dwVendorId) && (oBusSlaveInfo.bDc64Support == dwProductCode))
      {
        if (oBusSlaveInfo.adwReserved[2] == dwSlaveInstance) {
          *pwPhysAddr = oBusSlaveInfo._48_2_;
          return 1;
        }
        oBusSlaveInfo.adwReserved[2] = oBusSlaveInfo.adwReserved[2] + 1;
      }
    }
    else {
      CAtEmLogging::LogError
                (poLog,"PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x",(ulong)uVar1);
    }
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

EC_T_BOOL FindSlaveGetFixedAddr
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog
    ,EC_T_DWORD     dwSlaveInstance     /**< [in]   Slave instance (0 = first matching, 1 = second, ...) */
    ,EC_T_DWORD     dwVendorId          /**< [in]   Vendor Id of slave to search */
    ,EC_T_DWORD     dwProductCode       /**< [in]   Product Code of slave to search */
    ,EC_T_WORD*     pwPhysAddr)         /**< [out]  Physical Address of slave */
{
EC_T_DWORD dwRes              = EC_E_ERROR;
EC_T_DWORD dwSlaveIdx         = 0;
EC_T_DWORD dwSlaveInstanceCnt = 0;

    for (dwSlaveIdx = 0; dwSlaveIdx < emGetNumConnectedSlaves(dwInstanceID); dwSlaveIdx++)
    {
    EC_T_WORD           wAutoIncAddress = (EC_T_WORD)(0-dwSlaveIdx);
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;

        /* get information about bus slave */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            LogErr("PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x", dwRes);
            continue;
        }
        if ((oBusSlaveInfo.dwVendorId == dwVendorId) && (oBusSlaveInfo.dwProductCode == dwProductCode))
        {
            if (dwSlaveInstanceCnt == dwSlaveInstance)
            {
                /* slave found */
                *pwPhysAddr = oBusSlaveInfo.wStationAddress;
                return EC_TRUE;
            }
            dwSlaveInstanceCnt++;
        }
    }
    return EC_FALSE;
}